

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayStencilAttachments.cpp
# Opt level: O2

void __thiscall
glcts::TextureCubeMapArrayStencilAttachments::createMutableCubeArrayStencil
          (TextureCubeMapArrayStencilAttachments *this,GLuint test_index)

{
  CubeMapArrayDataStorage *pCVar1;
  int iVar2;
  deUint32 err;
  undefined4 extraout_var;
  
  iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  fillStencilData(this,test_index);
  pCVar1 = this->m_cube_map_array_data;
  (**(code **)(CONCAT44(extraout_var,iVar2) + 0x1320))
            (0x9009,0,0x88f0,pCVar1[test_index].m_width,pCVar1[test_index].m_height,
             pCVar1[test_index].m_depth,0,0x84f9,0x84fa,pCVar1[test_index].m_data_array);
  err = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
  glu::checkError(err,"Could not create a mutable stencil texture storage!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayStencilAttachments.cpp"
                  ,0x252);
  return;
}

Assistant:

void TextureCubeMapArrayStencilAttachments::createMutableCubeArrayStencil(glw::GLuint test_index)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	fillStencilData(test_index);

	gl.texImage3D(GL_TEXTURE_CUBE_MAP_ARRAY,						 /* target */
				  0,												 /* level */
				  GL_DEPTH24_STENCIL8,								 /* internal format */
				  m_cube_map_array_data[test_index].getWidth(),		 /* width */
				  m_cube_map_array_data[test_index].getHeight(),	 /* height */
				  m_cube_map_array_data[test_index].getDepth(),		 /* depth */
				  0,												 /* border */
				  GL_DEPTH_STENCIL,									 /* format */
				  GL_UNSIGNED_INT_24_8,								 /* type */
				  m_cube_map_array_data[test_index].getDataArray()); /* pixel data */

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create a mutable stencil texture storage!");
}